

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer_testing.cpp
# Opt level: O0

void __thiscall
correctness_and_signed_Test::~correctness_and_signed_Test(correctness_and_signed_Test *this)

{
  correctness_and_signed_Test *this_local;
  
  ~correctness_and_signed_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(correctness, and_signed) {
    big_integer a = 0x55;
    big_integer b = 0xaa;

    EXPECT_TRUE((b & -1) == 0xaa);
    EXPECT_TRUE((a & (0xaa - 256)) == 0);
    EXPECT_TRUE((a & (0xcc - 256)) == 0x44);

    big_integer c = 0x55;
    big_integer d = 0xcc;
    EXPECT_EQ(big_integer(0x44), c & d);
}